

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

Settings * __thiscall
soplex::SoPlexBase<double>::Settings::operator=(Settings *this,Settings *settings)

{
  int i_2;
  int i_1;
  int i;
  Settings *settings_local;
  Settings *this_local;
  
  for (i = 0; i < 0x1a; i = i + 1) {
    this->_boolParamValues[i] = (bool)(settings->_boolParamValues[i] & 1);
  }
  for (i_1 = 0; i_1 < 0x1c; i_1 = i_1 + 1) {
    this->_intParamValues[i_1] = settings->_intParamValues[i_1];
  }
  for (i_2 = 0; i_2 < 0x1b; i_2 = i_2 + 1) {
    this->_realParamValues[i_2] = settings->_realParamValues[i_2];
  }
  return this;
}

Assistant:

typename SoPlexBase<R>::Settings& SoPlexBase<R>::Settings::operator=(const Settings& settings)
{
   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
      _boolParamValues[i] = settings._boolParamValues[i];

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
      _intParamValues[i] = settings._intParamValues[i];

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
      _realParamValues[i] = settings._realParamValues[i];

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
      _rationalParamValues[i] = settings._rationalParamValues[i];

#endif

   return *this;
}